

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

Net * __thiscall notch::core::Net::append(Net *this,ABackpropLayer *layer)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  (*layer->_vptr_ABackpropLayer[0xb])(local_20);
  iVar1 = (**this->_vptr_Net)(this,local_20);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return (Net *)CONCAT44(extraout_var,iVar1);
}

Assistant:

virtual Net &append(const ABackpropLayer &layer) {
        return append(layer.clone());
    }